

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qspinbox.cpp
# Opt level: O3

void __thiscall QDoubleSpinBox::setPrefix(QDoubleSpinBox *this,QString *prefix)

{
  long *plVar1;
  
  plVar1 = *(long **)&(this->super_QAbstractSpinBox).super_QWidget.field_0x8;
  QString::operator=((QString *)(plVar1 + 0x4b),(QString *)prefix);
  (**(code **)(*plVar1 + 0xc0))(plVar1);
  *(undefined4 *)(plVar1 + 0x6d) = 0xffffffff;
  *(undefined4 *)((long)plVar1 + 0x36c) = 0xffffffff;
  *(undefined4 *)(plVar1 + 0x6e) = 0xffffffff;
  *(undefined4 *)((long)plVar1 + 0x374) = 0xffffffff;
  QWidget::updateGeometry((QWidget *)this);
  return;
}

Assistant:

void QDoubleSpinBox::setPrefix(const QString &prefix)
{
    Q_D(QDoubleSpinBox);

    d->prefix = prefix;
    d->updateEdit();

    d->cachedSizeHint = QSize();
    d->cachedMinimumSizeHint = QSize(); // minimumSizeHint cares about the prefix
    updateGeometry();
}